

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_get_available_frames(ma_decoder *pDecoder,ma_uint64 *pAvailableFrames)

{
  ma_result mVar1;
  ma_uint64 mVar2;
  ma_uint64 totalFrameCount;
  ma_uint64 local_18;
  
  mVar1 = MA_INVALID_ARGS;
  if (pAvailableFrames != (ma_uint64 *)0x0) {
    local_18 = 0xfffffffe;
    *pAvailableFrames = 0;
    if ((pDecoder != (ma_decoder *)0x0) &&
       (mVar1 = ma_decoder_get_length_in_pcm_frames(pDecoder,&local_18), mVar1 == MA_SUCCESS)) {
      mVar1 = MA_SUCCESS;
      mVar2 = 0;
      if (pDecoder->readPointerInPCMFrames <= local_18) {
        mVar2 = local_18 - pDecoder->readPointerInPCMFrames;
      }
      *pAvailableFrames = mVar2;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_get_available_frames(ma_decoder* pDecoder, ma_uint64* pAvailableFrames)
{
    ma_result result;
    ma_uint64 totalFrameCount;

    if (pAvailableFrames == NULL) {
        return MA_INVALID_ARGS;
    }

    *pAvailableFrames = 0;

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_decoder_get_length_in_pcm_frames(pDecoder, &totalFrameCount);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (totalFrameCount <= pDecoder->readPointerInPCMFrames) {
        *pAvailableFrames = 0;
    } else {
        *pAvailableFrames = totalFrameCount - pDecoder->readPointerInPCMFrames;
    }

    return MA_SUCCESS;
}